

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Dam_PrintDiv(Dam_Man_t *p,int iDiv)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  char Buffer [100];
  timespec local_98 [7];
  
  if (iDiv == 0) {
    printf("Final statistics after extracting %6d divisors:          ",(ulong)(uint)p->nDivs);
LAB_007034d1:
    iVar6 = p->vHash->vObjs->nSize;
    iVar7 = iVar6 + 3;
    if (-1 < iVar6) {
      iVar7 = iVar6;
    }
    printf("Divs =%8d  ",(ulong)((iVar7 >> 2) - 1));
    printf("Ands =%8d  ",(ulong)(uint)(p->nAnds - p->nGain));
    iVar7 = 3;
    iVar6 = clock_gettime(3,local_98);
    if (iVar6 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_98[0].tv_nsec / 1000 + local_98[0].tv_sec * 1000000;
    }
    lVar5 = p->clkStart;
    Abc_Print(iVar7,"%s =","Time");
    Abc_Print(iVar7,"%9.2f sec\n",(double)(lVar8 - lVar5) / 1000000.0);
    return;
  }
  if (-1 < iDiv) {
    pVVar3 = p->vHash->vObjs;
    uVar2 = iDiv * 4;
    uVar1 = pVVar3->nSize;
    if (uVar1 != uVar2 && SBORROW4(uVar1,uVar2) == (int)(uVar1 + iDiv * -4) < 0) {
      piVar4 = pVVar3->pArray;
      uVar1 = piVar4[uVar2];
      uVar2 = piVar4[(ulong)uVar2 + 1];
      printf("Div%5d : ",(ulong)(p->nDivs + 1));
      printf("D%-8d = ",(ulong)(uint)iDiv);
      if (-1 < (int)uVar1) {
        sprintf((char *)local_98,"%c%d",(ulong)(uVar1 & 1 | 0x20),(ulong)(uVar1 >> 1));
        printf("%8s ",local_98);
        printf("%c  ",(ulong)((int)uVar1 < (int)uVar2 ^ 0x2b));
        if (-1 < (int)uVar2) {
          sprintf((char *)local_98,"%c%d",(ulong)(uVar2 & 1 | 0x20),(ulong)(uVar2 >> 1));
          printf("%8s   ",local_98);
          if (p->vCounts->nSize <= iDiv) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          printf("Weight %9.2f  ",(double)p->vCounts->pArray[(uint)iDiv]);
          goto LAB_007034d1;
        }
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

void Dam_PrintDiv( Dam_Man_t * p, int iDiv )
{
    if ( iDiv == 0 )
        printf( "Final statistics after extracting %6d divisors:          ", p->nDivs );
    else
    {
        char Buffer[100];
        int iData0 = Hash_IntObjData0(p->vHash, iDiv);
        int iData1 = Hash_IntObjData1(p->vHash, iDiv);
        printf( "Div%5d : ",  p->nDivs+1 );
        printf( "D%-8d = ",   iDiv );
        sprintf( Buffer, "%c%d", Abc_LitIsCompl(iData0)? '!':' ', Abc_Lit2Var(iData0) );
        printf( "%8s ",   Buffer );
        printf( "%c  ",     (iData0 < iData1) ? '*' : '+' );
        sprintf( Buffer, "%c%d", Abc_LitIsCompl(iData1)? '!':' ', Abc_Lit2Var(iData1) );
        printf( "%8s   ", Buffer );
        printf( "Weight %9.2f  ", Vec_FltEntry(p->vCounts, iDiv) );
    }
    printf( "Divs =%8d  ",  Hash_IntManEntryNum(p->vHash) );
    printf( "Ands =%8d  ",  p->nAnds - p->nGain );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
}